

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::JulianDayFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  ScalarFunctionSet *in_RDI;
  _func_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_ClientContext_ptr_FunctionStatisticsInput_ptr
  *ts_stats;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *ts_func;
  _func_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_ClientContext_ptr_FunctionStatisticsInput_ptr
  *date_stats;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *date_func;
  ScalarFunctionSet *operator_set;
  allocator_type *in_stack_fffffffffffffb58;
  code *function;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffb60;
  ScalarFunction *this;
  ScalarFunction *pSVar3;
  undefined8 in_stack_fffffffffffffb68;
  undefined1 *puVar4;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffb74;
  LogicalTypeId in_stack_fffffffffffffb7f;
  LogicalType *in_stack_fffffffffffffb80;
  LogicalType *this_00;
  ScalarFunctionSet *in_stack_fffffffffffffba0;
  _Invoker_type *local_418;
  undefined1 **local_3f0;
  bind_scalar_function_extended_t in_stack_fffffffffffffc80;
  bind_scalar_function_t in_stack_fffffffffffffc88;
  scalar_function_t *in_stack_fffffffffffffc90;
  scalar_function_t *function_00;
  undefined8 in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  ScalarFunction *in_stack_fffffffffffffca8;
  _Invoker_type local_350;
  undefined8 local_348;
  function_statistics_t in_stack_fffffffffffffce0;
  init_local_state_t in_stack_fffffffffffffce8;
  LogicalType *in_stack_fffffffffffffcf0;
  FunctionStability in_stack_fffffffffffffcf8;
  FunctionNullHandling in_stack_fffffffffffffd00;
  bind_lambda_function_t in_stack_fffffffffffffd08;
  undefined1 local_1f0 [96];
  undefined8 *local_190;
  undefined1 *local_188 [3];
  undefined8 *local_170;
  undefined8 local_168;
  ScalarFunction *local_20;
  code *local_18;
  undefined1 local_9;
  
  local_9 = 0;
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffffba0);
  local_18 = DatePart::UnaryFunction<duckdb::date_t,double,duckdb::DatePart::JulianDayOperator>;
  local_20 = (ScalarFunction *)DatePart::JulianDayOperator::PropagateStatistics<duckdb::date_t>;
  local_190 = local_188;
  LogicalType::LogicalType(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7f);
  local_170 = local_188;
  local_168 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1eccdca);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffb70;
  iVar1._M_array = (iterator)in_stack_fffffffffffffb68;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffb74;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffb60,iVar1,
             in_stack_fffffffffffffb58);
  LogicalType::LogicalType(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(*&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (in_stack_fffffffffffffb60,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)in_stack_fffffffffffffb58);
  pSVar3 = local_20;
  LogicalType::LogicalType(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7f);
  puVar4 = local_1f0;
  this_00 = (LogicalType *)0x0;
  uVar5 = 0;
  this = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffffca8,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffca0,
             (LogicalType *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,
             in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,pSVar3);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x1ecced3);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x1eccee0);
  LogicalType::~LogicalType((LogicalType *)0x1ecceed);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1eccefa);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1eccf07);
  local_3f0 = (undefined1 **)&local_170;
  do {
    local_3f0 = local_3f0 + -3;
    LogicalType::~LogicalType((LogicalType *)0x1eccf3c);
  } while (local_3f0 != local_188);
  function_00 = (scalar_function_t *)&stack0xfffffffffffffc98;
  LogicalType::LogicalType(this_00,in_stack_fffffffffffffb7f);
  local_350 = (_Invoker_type)&stack0xfffffffffffffc98;
  local_348 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1eccfc4);
  iVar2._M_len._0_4_ = uVar5;
  iVar2._M_array = (iterator)puVar4;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffb74;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)this,iVar2,(allocator_type *)pSVar3);
  LogicalType::LogicalType(this_00,in_stack_fffffffffffffb7f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(*&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             this,(_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)pSVar3);
  LogicalType::LogicalType(this_00,in_stack_fffffffffffffb7f);
  function = DatePart::JulianDayOperator::PropagateStatistics<duckdb::timestamp_t>;
  pSVar3 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffffca8,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffca0,
             (LogicalType *)in_stack_fffffffffffffc98,function_00,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffc80,in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,
             in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffd08);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar3,(ScalarFunction *)function);
  ScalarFunction::~ScalarFunction(pSVar3);
  LogicalType::~LogicalType((LogicalType *)0x1ecd0cd);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x1ecd0da);
  LogicalType::~LogicalType((LogicalType *)0x1ecd0e7);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1ecd0f4);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1ecd101);
  local_418 = &local_350;
  do {
    local_418 = local_418 + -3;
    LogicalType::~LogicalType((LogicalType *)0x1ecd136);
  } while (local_418 != (_Invoker_type *)&stack0xfffffffffffffc98);
  return in_RDI;
}

Assistant:

ScalarFunctionSet JulianDayFun::GetFunctions() {
	using OP = DatePart::JulianDayOperator;

	ScalarFunctionSet operator_set;
	auto date_func = DatePart::UnaryFunction<date_t, double, OP>;
	auto date_stats = OP::template PropagateStatistics<date_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::DATE}, LogicalType::DOUBLE, date_func, nullptr, nullptr, date_stats));
	auto ts_func = DatePart::UnaryFunction<timestamp_t, double, OP>;
	auto ts_stats = OP::template PropagateStatistics<timestamp_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::DOUBLE, ts_func, nullptr, nullptr, ts_stats));

	return operator_set;
}